

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

QueueDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::QueueDimensionSpecifierSyntax,slang::parsing::Token&,slang::syntax::ColonExpressionClauseSyntax*&>
          (BumpAllocator *this,Token *args,ColonExpressionClauseSyntax **args_1)

{
  Token dollar;
  QueueDimensionSpecifierSyntax *this_00;
  ColonExpressionClauseSyntax **args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (QueueDimensionSpecifierSyntax *)allocate(this,0x28,8);
  dollar.kind = args->kind;
  dollar._2_1_ = args->field_0x2;
  dollar.numFlags.raw = (args->numFlags).raw;
  dollar.rawLen = args->rawLen;
  dollar.info = args->info;
  slang::syntax::QueueDimensionSpecifierSyntax::QueueDimensionSpecifierSyntax
            (this_00,dollar,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }